

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O0

void __thiscall cali::NodeBuffer::append(NodeBuffer *this,NodeInfo *info)

{
  size_t sVar1;
  size_t sVar2;
  NodeInfo *info_local;
  NodeBuffer *this_local;
  
  sVar2 = this->m_pos;
  sVar1 = anon_unknown.dwarf_15986::max_packed_size(info);
  reserve(this,sVar2 + sVar1);
  sVar2 = anon_unknown.dwarf_15986::pack_node(this->m_buffer + this->m_pos,info);
  this->m_pos = sVar2 + this->m_pos;
  this->m_count = this->m_count + 1;
  return;
}

Assistant:

void NodeBuffer::append(const NodeInfo& info)
{
    reserve(m_pos + max_packed_size(info));

    m_pos += ::pack_node(m_buffer + m_pos, info);
    ++m_count;
}